

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_dc_top_predictor_4x16_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  uint uVar11;
  ushort uVar12;
  ushort uVar15;
  undefined4 uVar13;
  ushort uVar16;
  ushort uVar17;
  undefined1 auVar14 [16];
  
  uVar1 = *(ulong *)above;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar7._8_7_;
  auVar9._1_8_ = SUB158(auVar8 << 0x40,7);
  auVar9[0] = (char)(uVar1 >> 0x18);
  auVar9._9_6_ = 0;
  auVar10._1_10_ = SUB1510(auVar9 << 0x30,5);
  auVar10[0] = (char)(uVar1 >> 0x10);
  auVar10._11_4_ = 0;
  auVar14._3_12_ = SUB1512(auVar10 << 0x20,3);
  auVar14[2] = (char)(uVar1 >> 8);
  auVar14[0] = (byte)uVar1;
  auVar14[1] = 0;
  auVar14[0xf] = 0;
  auVar14 = psadbw(auVar14,(undefined1  [16])0x0);
  auVar14 = pshuflw(auVar14,auVar14,0);
  uVar12 = (ushort)(auVar14._0_2_ + 2U) >> 2;
  uVar15 = (ushort)(auVar14._2_2_ + 2U) >> 2;
  uVar16 = (ushort)(auVar14._4_2_ + 2U) >> 2;
  uVar17 = (ushort)(auVar14._6_2_ + 2U) >> 2;
  uVar13 = CONCAT13((uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17),
                    CONCAT12((uVar16 != 0) * (uVar16 < 0x100) * (char)uVar16 - (0xff < uVar16),
                             CONCAT11((uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 -
                                      (0xff < uVar15),
                                      (uVar12 != 0) * (uVar12 < 0x100) * (char)uVar12 -
                                      (0xff < uVar12))));
  uVar11 = 0xfffffffe;
  do {
    *(undefined4 *)dst = uVar13;
    *(undefined4 *)(dst + stride) = uVar13;
    dst = dst + stride * 2;
    uVar11 = uVar11 + 2;
  } while (uVar11 < 0xe);
  return;
}

Assistant:

void aom_dc_top_predictor_4x16_sse2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  (void)left;
  __m128i sum_above = dc_sum_4(above);
  const __m128i two = _mm_set1_epi16(2);
  sum_above = _mm_add_epi16(sum_above, two);
  sum_above = _mm_srai_epi16(sum_above, 2);
  sum_above = _mm_shufflelo_epi16(sum_above, 0);
  sum_above = _mm_packus_epi16(sum_above, sum_above);

  const uint32_t pred = (uint32_t)_mm_cvtsi128_si32(sum_above);
  dc_store_4xh(pred, 16, dst, stride);
}